

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetContextActivateMetricGroupsPrologue
          (ZETParameterValidation *this,zet_context_handle_t hContext,zet_device_handle_t hDevice,
          uint32_t count,zet_metric_group_handle_t *phMetricGroups)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_SIZE;
  if (phMetricGroups != (zet_metric_group_handle_t *)0x0) {
    zVar1 = ZE_RESULT_SUCCESS;
  }
  if (count == 0) {
    zVar1 = ZE_RESULT_SUCCESS;
  }
  if (hDevice == (zet_device_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (hContext == (zet_context_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetContextActivateMetricGroupsPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t count,                                 ///< [in] metric group count to activate; must be 0 if `nullptr ==
                                                        ///< phMetricGroups`
        zet_metric_group_handle_t* phMetricGroups       ///< [in][optional][range(0, count)] handles of the metric groups to activate.
                                                        ///< nullptr deactivates all previously used metric groups.
                                                        ///< all metrics groups must come from a different domains.
                                                        ///< metric query and metric stream must use activated metric groups.
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( (nullptr == phMetricGroups) && (0 < count) )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        return ZE_RESULT_SUCCESS;
    }